

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo_begin_symbol_text
              (nk_context *ctx,char *selected,int len,nk_symbol_type symbol,nk_vec2 size)

{
  nk_command_buffer *out;
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  nk_widget_layout_states nVar2;
  int iVar3;
  nk_color foreground;
  long lVar4;
  nk_context *i;
  nk_style_combo *pnVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect content;
  nk_rect b;
  nk_rect header;
  nk_color local_a8;
  nk_text text;
  nk_rect local_50;
  nk_rect button;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x611b,
                  "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    if (win->layout != (nk_panel *)0x0) {
      nVar2 = nk_widget(&header,ctx);
      fVar9 = header.h;
      fVar8 = header.w;
      fVar7 = header.y;
      fVar6 = header.x;
      if (nVar2 == NK_WIDGET_INVALID) {
        iVar3 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar2 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        rect_00.y = header.y;
        rect_00.x = header.x;
        rect_00.h = header.h;
        rect_00.w = header.w;
        r.y = header.y;
        r.x = header.x;
        r.w = header.w;
        r.h = header.h;
        iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        if ((ctx->last_widget_state & 0x20) == 0) {
          if ((ctx->last_widget_state & 0x10) == 0) {
            pnVar5 = &(ctx->style).combo;
            text.text = (ctx->style).combo.label_normal;
            foreground = (ctx->style).combo.symbol_normal;
          }
          else {
            pnVar5 = (nk_style_combo *)&(ctx->style).combo.hover;
            text.text = (ctx->style).combo.label_hover;
            foreground = (ctx->style).combo.symbol_hover;
          }
        }
        else {
          pnVar5 = (nk_style_combo *)&(ctx->style).combo.active;
          text.text = (ctx->style).combo.label_active;
          foreground = (ctx->style).combo.symbol_active;
        }
        if ((pnVar5->normal).type == NK_STYLE_ITEM_IMAGE) {
          text.background.r = '\0';
          text.background.g = '\0';
          text.background.b = '\0';
          text.background.a = '\0';
          r_00.w = fVar8;
          r_00.h = fVar9;
          r_00.x = fVar6;
          r_00.y = fVar7;
          nk_draw_image(&win->buffer,r_00,&(pnVar5->normal).data.image,(nk_color)0xffffffff);
          local_a8.r = '\0';
          local_a8.g = '\0';
          local_a8.b = '\0';
          local_a8.a = '\0';
        }
        else {
          local_a8 = (pnVar5->normal).data.color;
          text.background = local_a8;
          nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,local_a8);
          rect.y = header.y;
          rect.x = header.x;
          rect.w = header.w;
          rect.h = header.h;
          nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar4 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar4 = (ulong)(iVar3 != 0) * 8 + 0x1be0;
        }
        fVar6 = (ctx->style).combo.button_padding.y;
        button.w = header.h - (fVar6 + fVar6);
        fVar8 = ((header.x + header.w) - header.h) - (ctx->style).combo.button_padding.x;
        button.y = fVar6 + header.y;
        nVar1 = (ctx->style).combo.button.padding;
        fVar6 = nVar1.x;
        local_50.x = fVar8 + fVar6;
        fVar7 = nVar1.y;
        local_50.y = button.y + fVar7;
        local_50.w = button.w - (fVar6 + fVar6);
        local_50.h = button.w - (fVar7 + fVar7);
        out = &win->buffer;
        button.x = fVar8;
        button.h = button.w;
        nk_draw_button_symbol
                  (out,&button,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                   *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar4),
                   (ctx->style).font);
        nVar1 = (ctx->style).combo.content_padding;
        fVar6 = header.x + nVar1.x;
        fVar7 = nVar1.y;
        content.w = header.h - (fVar7 + fVar7);
        content.y = header.y + fVar7;
        content.x = fVar6;
        content.h = content.w;
        nk_draw_symbol(out,symbol,content,local_a8,foreground,1.0,(ctx->style).font);
        text.padding.x = 0.0;
        text.padding.y = 0.0;
        nVar1 = (ctx->style).combo.content_padding;
        fVar7 = nVar1.x;
        fVar9 = nVar1.y;
        b.x = content.w + fVar6 + (ctx->style).combo.spacing.x + fVar7;
        b.y = header.y + fVar9;
        b.w = (fVar8 - fVar7) - b.x;
        b.h = header.h - (fVar9 + fVar9);
        nk_widget_text(out,b,selected,len,&text,0x11,(ctx->style).font);
        header_00.y = header.y;
        header_00.x = header.x;
        header_00.w = header.w;
        header_00.h = header.h;
        iVar3 = nk_combo_begin(ctx,win,size,(uint)(iVar3 != 0),header_00);
      }
      return iVar3;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x611d,
                  "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x611c,
                "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_symbol_text(struct nk_context *ctx, const char *selected, int len,
    enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color symbol_color;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw symbol */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_symbol(&win->buffer, symbol, image, text.background, symbol_color,
            1.0f, style->font);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}